

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O1

bool __thiscall M_tree::compare(M_tree *this)

{
  pointer pcVar1;
  pointer pcVar2;
  Node *pNVar3;
  Node *pNVar4;
  pointer pbVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  ostream *poVar10;
  long *plVar11;
  pointer pcVar12;
  undefined8 extraout_RAX;
  ulong uVar13;
  size_type *psVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  string item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  differ;
  string rm_head;
  string cp_head;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"cp ","");
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"rm ","");
  pNVar3 = this->pNode;
  pNVar4 = this->ofolder;
  if (pNVar3->hashn[0] == pNVar4->hashn[0]) {
    uVar16 = 0;
    do {
      uVar13 = uVar16;
      if (uVar13 == 7) break;
      uVar16 = uVar13 + 1;
    } while (pNVar3->hashn[uVar13 + 1] == pNVar4->hashn[uVar13 + 1]);
    if (6 < uVar13) {
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      return true;
    }
  }
  bVar8 = std::operator!=(&pNVar3->key,&pNVar4->key);
  if (bVar8) {
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)((long)(this->pNode->key).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->pNode->key).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (0 < (int)(uint)local_e8) {
      local_38 = &this->folder_name1;
      local_40 = &this->folder_name2;
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)((uint)local_e8 & 0x7fffffff);
      lVar17 = 8;
      do {
        pbVar5 = (this->pNode->key).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        lVar6 = *(long *)((long)pbVar5 + lVar17 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,lVar6,
                   *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar17) + lVar6);
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((this->ofolder->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->ofolder->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_128);
        if (_Var9._M_current ==
            (this->ofolder->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File: ",6);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_128._M_dataplus._M_p,
                               local_128._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," are lost. We are copying",0x19);
          std::endl<char,std::char_traits<char>>(poVar10);
          std::operator+(&local_c0,local_38,"/");
          std::operator+(&local_a0,&local_c0,&local_128);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          psVar14 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_e0.field_2._M_allocated_capacity = *psVar14;
            local_e0.field_2._8_8_ = plVar11[3];
          }
          else {
            local_e0.field_2._M_allocated_capacity = *psVar14;
            local_e0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_e0._M_string_length = plVar11[1];
          *plVar11 = (long)psVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::operator+(&local_108,&local_e0,local_40);
          std::__cxx11::string::_M_append((char *)local_60,(ulong)local_108._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          system((char *)local_60[0]);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"cp ","");
          std::__cxx11::string::operator=((string *)local_60,(string *)&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        lVar17 = lVar17 + 0x20;
        local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&local_e8[-1].field_2 + 0xf);
      } while (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
    }
    uVar15 = (uint)((ulong)((long)(this->ofolder->key).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->ofolder->key).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (0 < (int)uVar15) {
      local_e8 = &this->folder_name2;
      uVar16 = (ulong)(uVar15 & 0x7fffffff);
      lVar17 = 8;
      do {
        pbVar5 = (this->ofolder->key).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        lVar6 = *(long *)((long)pbVar5 + lVar17 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,lVar6,
                   *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar17) + lVar6);
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          ((this->pNode->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->pNode->key).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_128);
        if (_Var9._M_current ==
            (this->pNode->key).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File: ",6);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_128._M_dataplus._M_p,
                               local_128._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," are redundant. We are deleting",0x1f);
          std::endl<char,std::char_traits<char>>(poVar10);
          std::operator+(&local_e0,local_e8,"/");
          std::operator+(&local_108,&local_e0,&local_128);
          std::__cxx11::string::_M_append((char *)local_80,(ulong)local_108._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          system((char *)local_80[0]);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"rm ","");
          std::__cxx11::string::operator=((string *)local_80,(string *)&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        lVar17 = lVar17 + 0x20;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    build(this,(this->folder_name2)._M_dataplus._M_p,3);
  }
  pNVar3 = this->pNode;
  pNVar4 = this->ofolder;
  if (pNVar3->hashn[0] == pNVar4->hashn[0]) {
    lVar17 = 0;
    do {
      if (lVar17 == 7) break;
      lVar6 = lVar17 + 1;
      lVar7 = lVar17 + 1;
      lVar17 = lVar17 + 1;
    } while (pNVar3->hashn[lVar6] == pNVar4->hashn[lVar7]);
  }
  compare_tree_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0,this,pNVar3,pNVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wrong files:\n",0xd);
  if (local_c0._M_dataplus._M_p != (pointer)local_c0._M_string_length) {
    local_e8 = &this->folder_name2;
    do {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,*(char **)(local_c0._M_string_length + -0x20),
                           *(long *)(local_c0._M_string_length + -0x18));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," is wrong. We are fixing it...",0x1e);
      std::endl<char,std::char_traits<char>>(poVar10);
      std::operator+(&local_108,local_e8,"/");
      std::operator+(&local_128,&local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c0._M_string_length + -0x20));
      std::__cxx11::string::_M_append((char *)local_80,(ulong)local_128._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      system((char *)local_80[0]);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"rm ","");
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_a0,&this->folder_name1,"/");
      std::operator+(&local_e0,&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c0._M_string_length + -0x20));
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar14 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_108.field_2._M_allocated_capacity = *psVar14;
        local_108.field_2._8_8_ = plVar11[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar14;
        local_108._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_108._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::operator+(&local_128,&local_108,local_e8);
      std::__cxx11::string::_M_append((char *)local_60,(ulong)local_128._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      system((char *)local_60[0]);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"cp ","");
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (pointer)(local_c0._M_string_length + -0x20);
      pcVar2 = (pointer)(local_c0._M_string_length + -0x20);
      pcVar12 = (pointer)(local_c0._M_string_length + -0x10);
      local_c0._M_string_length = (size_type)pcVar1;
      if (*(pointer *)pcVar2 != pcVar12) {
        operator_delete(*(pointer *)pcVar2,*(long *)pcVar12 + 1);
      }
    } while (local_c0._M_dataplus._M_p != (pointer)local_c0._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

bool M_tree::compare() {
    string cp_head = string("cp ");
    string rm_head = string("rm ");
    if(hash_cmp(this->pNode->hashn, this->ofolder->hashn)){
        return true;
    }else{
        if(this->pNode->key != this->ofolder->key){
            int n = this->pNode->key.size();
            int i;
            vector<string>::iterator it;
            for(i=0;i<n;i++){
                string item = this->pNode->key[i];
                it = find(this->ofolder->key.begin(), this->ofolder->key.end(), item);
                if(it == this->ofolder->key.end()){
                    //the file is not in fold2
                    cout << "File: " << item << " are lost. We are copying" << endl;
                    cp_head += folder_name1 + "/" + item + " " + folder_name2;
                    system(cp_head.c_str());
                    cp_head = string("cp ");
                }
            }
            n = this->ofolder->key.size();
            for(i = 0;i<n;i++){
                string item = this->ofolder->key[i];
                it = find(this->pNode->key.begin(), this->pNode->key.end(), item);
                if(it == this->pNode->key.end()){
                    //the file need to be deleted
                    cout << "File: " << item << " are redundant. We are deleting" << endl;
                    rm_head += folder_name2 + "/" + item;
                    system(rm_head.c_str());
                    rm_head = string("rm ");
                }
            }
            this->build(const_cast<char *>(folder_name2.c_str()), 3);
        }
        if(!hash_cmp(this->pNode->hashn, this->ofolder->hashn)){
            vector<string> differ(M_tree::compare_tree(this->pNode, this->ofolder));
            cout << "Wrong files:\n";
            while(!differ.empty()){
                cout << differ.back() << " is wrong. We are fixing it..." << endl;
                rm_head += this->folder_name2 + "/" + differ.back();
                system(rm_head.c_str());
                rm_head = string("rm ");
                cp_head += this->folder_name1 + "/" + differ.back() + " " + folder_name2;
                system(cp_head.c_str());
                cp_head = string("cp ");
                differ.pop_back();
            }
        }
    }
}